

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phix_manager.c
# Opt level: O2

int write_phix(int coff,opj_codestream_info_t cstr_info,opj_bool EPHused,int j2klen,opj_cio_t *cio)

{
  int v;
  int pos;
  OPJ_UINT32 OVar1;
  int pos_00;
  opj_jp2_box_t *box;
  long lVar2;
  undefined8 extraout_RDX;
  undefined8 uVar3;
  undefined8 extraout_RDX_00;
  opj_codestream_info_t *poVar4;
  double *pdVar5;
  int second;
  ulong uVar6;
  OPJ_UINT32 *pOVar7;
  ulong uVar8;
  byte bVar9;
  opj_codestream_info_t in_stack_ffffffffffffff38;
  int local_4c;
  
  v = cstr_info.numcomps;
  bVar9 = 0;
  box = (opj_jp2_box_t *)calloc((long)cstr_info.numcomps,0xc);
  uVar8 = 0;
  if (0 < v) {
    uVar8 = (ulong)(uint)v;
  }
  pos = 0;
  second = 0;
  do {
    if (second != 0) {
      if (second == 2) {
        free(box);
        return local_4c;
      }
      cio_seek(cio,pos);
    }
    pos = cio_tell(cio);
    cio_skip(cio,4);
    cio_write(cio,0x70686978,4);
    write_manf(second,v,box,cio);
    uVar3 = extraout_RDX;
    pOVar7 = &box->type;
    for (uVar6 = 0; uVar8 != uVar6; uVar6 = uVar6 + 1) {
      poVar4 = &cstr_info;
      pdVar5 = (double *)&stack0xffffffffffffff38;
      for (lVar2 = 0xe; lVar2 != 0; lVar2 = lVar2 + -1) {
        *pdVar5 = poVar4->D_max;
        poVar4 = (opj_codestream_info_t *)((long)poVar4 + (ulong)bVar9 * -0x10 + 8);
        pdVar5 = pdVar5 + (ulong)bVar9 * -2 + 1;
      }
      OVar1 = write_phixfaix(coff,(int)uVar6,in_stack_ffffffffffffff38,(opj_bool)uVar3,0,cio);
      ((opj_jp2_box_t *)(pOVar7 + -1))->length = OVar1;
      *pOVar7 = 0x66616978;
      pOVar7 = pOVar7 + 3;
      uVar3 = extraout_RDX_00;
    }
    pos_00 = cio_tell(cio);
    local_4c = pos_00 - pos;
    cio_seek(cio,pos);
    cio_write(cio,(long)local_4c,4);
    cio_seek(cio,pos_00);
    second = second + 1;
  } while( true );
}

Assistant:

int write_phix( int coff, opj_codestream_info_t cstr_info, opj_bool EPHused, int j2klen, opj_cio_t *cio)
{
  int len, lenp=0, compno, i;
  opj_jp2_box_t *box;

  box = (opj_jp2_box_t *)opj_calloc( cstr_info.numcomps, sizeof(opj_jp2_box_t));
  
  for( i=0;i<2;i++){
    if (i) cio_seek( cio, lenp);
      
    lenp = cio_tell( cio);
    cio_skip( cio, 4);              /* L [at the end] */
    cio_write( cio, JPIP_PHIX, 4);  /* PHIX           */
      
    write_manf( i, cstr_info.numcomps, box, cio);

    for( compno=0; compno<cstr_info.numcomps; compno++){       
      box[compno].length = write_phixfaix( coff, compno, cstr_info, EPHused, j2klen, cio);
      box[compno].type = JPIP_FAIX;
    }

    len = cio_tell( cio)-lenp;
    cio_seek( cio, lenp);
    cio_write( cio, len, 4);        /* L              */
    cio_seek( cio, lenp+len);
  }

  opj_free(box);

  return len;
}